

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O0

bool ImPlot::DragLineY(char *id,double *value,bool show_label,ImVec4 *col,float thickness)

{
  float _x;
  ImPlotContext *pIVar1;
  ImDrawList *pIVar2;
  ImU32 bg;
  bool bVar3;
  int iVar4;
  ImU32 fg;
  ImGuiWindow *pIVar5;
  float _y;
  float _y_00;
  ImVec2 IVar6;
  double dVar7;
  ImPlotPoint IVar8;
  float local_15c;
  ImVec4 *local_130;
  bool local_122;
  double local_118;
  bool dragging;
  ImVec2 local_100;
  char local_f8 [8];
  char buff [32];
  int yax;
  ImVec2 local_c0;
  ImVec2 new_cursor_pos;
  ImVec2 old_cursor_pos;
  ImVec2 local_a8;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  ImVec2 local_88;
  ImDrawList *local_80;
  ImDrawList *DrawList;
  undefined1 auStack_70 [4];
  ImU32 col32;
  ImVec4 color;
  float len;
  float fStack_54;
  bool outside;
  float y;
  float xr;
  float xl;
  float grab_size;
  ImPlotContext *gp;
  float thickness_local;
  ImVec4 *col_local;
  bool show_label_local;
  double *value_local;
  char *id_local;
  
  pIVar1 = GImPlot;
  if (GImPlot->CurrentPlot != (ImPlotPlot *)0x0) {
    _y = ImMax<float>(5.0,thickness);
    _x = (pIVar1->CurrentPlot->PlotRect).Min.x;
    local_15c = (pIVar1->CurrentPlot->PlotRect).Max.x;
    IVar6 = PlotToPixels(0.0,*value,-1);
    fStack_54 = IVar6.y;
    _y_00 = (float)(int)(fStack_54 + 0.5);
    local_122 = true;
    if ((pIVar1->CurrentPlot->PlotRect).Min.y - _y / 2.0 <= _y_00) {
      local_122 = (pIVar1->CurrentPlot->PlotRect).Max.y + _y / 2.0 < _y_00;
    }
    color.w._3_1_ = local_122;
    if (local_122 == false) {
      color.z = (pIVar1->Style).MajorTickLen.y;
      bVar3 = IsColorAuto(col);
      local_130 = col;
      if (bVar3) {
        local_130 = ImGui::GetStyleColorVec4(0);
      }
      auStack_70 = local_130->x;
      unique0x00012004 = local_130->y;
      color.x = local_130->z;
      color.y = local_130->w;
      DrawList._4_4_ = ImGui::ColorConvertFloat4ToU32((ImVec4 *)auStack_70);
      local_80 = GetPlotDrawList();
      PushPlotClipRect(0.0);
      pIVar2 = local_80;
      ImVec2::ImVec2(&local_88,_x,_y_00);
      ImVec2::ImVec2(&local_90,local_15c,_y_00);
      ImDrawList::AddLine(pIVar2,&local_88,&local_90,DrawList._4_4_,thickness);
      pIVar2 = local_80;
      ImVec2::ImVec2(&local_98,_x,_y_00);
      ImVec2::ImVec2(&local_a0,_x + color.z,_y_00);
      ImDrawList::AddLine(pIVar2,&local_98,&local_a0,DrawList._4_4_,thickness * 3.0);
      pIVar2 = local_80;
      ImVec2::ImVec2(&local_a8,local_15c,_y_00);
      ImVec2::ImVec2(&old_cursor_pos,local_15c - color.z,_y_00);
      ImDrawList::AddLine(pIVar2,&local_a8,&old_cursor_pos,DrawList._4_4_,thickness * 3.0);
      PopPlotClipRect();
      if (((pIVar1->CurrentPlot->Selecting & 1U) == 0) &&
         ((pIVar1->CurrentPlot->Querying & 1U) == 0)) {
        new_cursor_pos = ImGui::GetCursorScreenPos();
        ImVec2::ImVec2(&local_c0,_x,_y_00 - _y / 2.0);
        ImGui::SetItemAllowOverlap();
        pIVar5 = ImGui::GetCurrentWindow();
        (pIVar5->DC).CursorPos = local_c0;
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff38,local_15c - _x,_y);
        ImGui::InvisibleButton(id,(ImVec2 *)&stack0xffffffffffffff38,0);
        pIVar5 = ImGui::GetCurrentWindow();
        (pIVar5->DC).CursorPos = new_cursor_pos;
        iVar4 = GetCurrentYAxis();
        bVar3 = ImGui::IsItemHovered(0);
        if ((bVar3) || (bVar3 = ImGui::IsItemActive(), bVar3)) {
          pIVar1->CurrentPlot->PlotHovered = false;
          ImGui::SetMouseCursor(3);
          if (show_label) {
            LabelAxisValue(pIVar1->CurrentPlot->YAxis + iVar4,pIVar1->YTicks + iVar4,*value,local_f8
                           ,0x20);
            if (iVar4 == 0) {
              local_15c = _x;
            }
            ImVec2::ImVec2(&local_100,local_15c,_y_00);
            ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffef8,0.0,0.0);
            bg = DrawList._4_4_;
            fg = CalcTextColor((ImVec4 *)auStack_70);
            ImPlotAnnotationCollection::Append
                      (&pIVar1->Annotations,&local_100,(ImVec2 *)&stack0xfffffffffffffef8,bg,fg,true
                       ,"%s = %s",id,local_f8);
          }
        }
        id_local._7_1_ = false;
        bVar3 = ImGui::IsItemActive();
        if ((bVar3) && (bVar3 = ImGui::IsMouseDragging(0,-1.0), bVar3)) {
          IVar8 = GetPlotMousePos(-1);
          local_118 = IVar8.y;
          *value = local_118;
          dVar7 = ImClamp<double>(*value,pIVar1->CurrentPlot->YAxis[iVar4].Range.Min,
                                  pIVar1->CurrentPlot->YAxis[iVar4].Range.Max);
          *value = dVar7;
          id_local._7_1_ = true;
        }
      }
      else {
        id_local._7_1_ = false;
      }
    }
    else {
      id_local._7_1_ = false;
    }
    return id_local._7_1_;
  }
  __assert_fail("(gp.CurrentPlot != __null) && \"DragLineY() needs to be called between BeginPlot() and EndPlot()!\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                ,0xb43,"bool ImPlot::DragLineY(const char *, double *, bool, const ImVec4 &, float)"
               );
}

Assistant:

bool DragLineY(const char* id, double* value, bool show_label, const ImVec4& col, float thickness) {
    ImPlotContext& gp = *GImPlot;
    IM_ASSERT_USER_ERROR(gp.CurrentPlot != NULL, "DragLineY() needs to be called between BeginPlot() and EndPlot()!");
    const float grab_size = ImMax(5.0f, thickness);
    float xl = gp.CurrentPlot->PlotRect.Min.x;
    float xr = gp.CurrentPlot->PlotRect.Max.x;
    float y  = IM_ROUND(PlotToPixels(0, *value).y);
    const bool outside = y < (gp.CurrentPlot->PlotRect.Min.y - grab_size / 2) || y > (gp.CurrentPlot->PlotRect.Max.y + grab_size / 2);
    if (outside)
        return false;
    float len = gp.Style.MajorTickLen.y;
    ImVec4 color = IsColorAuto(col) ? ImGui::GetStyleColorVec4(ImGuiCol_Text) : col;
    ImU32 col32 = ImGui::ColorConvertFloat4ToU32(color);
    ImDrawList& DrawList = *GetPlotDrawList();
    PushPlotClipRect();
    DrawList.AddLine(ImVec2(xl,y), ImVec2(xr,y),     col32, thickness);
    DrawList.AddLine(ImVec2(xl,y), ImVec2(xl+len,y), col32, 3*thickness);
    DrawList.AddLine(ImVec2(xr,y), ImVec2(xr-len,y), col32, 3*thickness);
    PopPlotClipRect();
    if (gp.CurrentPlot->Selecting || gp.CurrentPlot->Querying)
        return false;
    ImVec2 old_cursor_pos = ImGui::GetCursorScreenPos();
    ImVec2 new_cursor_pos = ImVec2(xl, y - grab_size / 2.0f);
    ImGui::SetItemAllowOverlap();
    ImGui::GetCurrentWindow()->DC.CursorPos = new_cursor_pos;
    ImGui::InvisibleButton(id, ImVec2(xr - xl, grab_size));
    ImGui::GetCurrentWindow()->DC.CursorPos = old_cursor_pos;
    int yax = GetCurrentYAxis();
    if (ImGui::IsItemHovered() || ImGui::IsItemActive()) {
        gp.CurrentPlot->PlotHovered = false;
        ImGui::SetMouseCursor(ImGuiMouseCursor_ResizeNS);
        if (show_label) {
            char buff[32];
            LabelAxisValue(gp.CurrentPlot->YAxis[yax], gp.YTicks[yax], *value, buff, 32);
            gp.Annotations.Append(ImVec2(yax == 0 ? xl : xr,y), ImVec2(0,0), col32, CalcTextColor(color), true,  "%s = %s", id, buff);
        }
    }
    bool dragging = false;
    if (ImGui::IsItemActive() && ImGui::IsMouseDragging(0)) {
        *value = ImPlot::GetPlotMousePos().y;
        *value = ImClamp(*value, gp.CurrentPlot->YAxis[yax].Range.Min, gp.CurrentPlot->YAxis[yax].Range.Max);
        dragging = true;
    }
    return dragging;
}